

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef::~QuestionRef(QuestionRef *this)

{
  RpcConnectionState *pRVar1;
  long lVar2;
  Question *in_RCX;
  anon_class_24_3_529c73a4 *func;
  NullableValue<kj::Exception> _e2317;
  Question local_390;
  Maybe<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>_> *local_368;
  QuestionRef *local_360;
  NullableValue<kj::Exception> local_350;
  NullableValue<kj::Exception> local_1b8;
  
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_00664208;
  pRVar1 = (this->connectionState).ptr.ptr;
  if (pRVar1 != (RpcConnectionState *)0x0) {
    anon_unknown_18::
    ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::find
              ((ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *)
               &local_350,(int)pRVar1 + 0x248);
    lVar2 = CONCAT71(local_350._1_7_,local_350.isSet);
    if (lVar2 == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                ((Fault *)&local_350,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x8fa,FAILED,"connectionState->questions.find(id) != nullptr",
                 "\"Question ID no longer on table?\"",
                 (char (*) [32])"Question ID no longer on table?");
      kj::_::Debug::Fault::fatal((Fault *)&local_350);
    }
    if (((((this->connectionState).ptr.ptr)->connection).tag == 1) &&
       (*(char *)(lVar2 + 0x22) == '\0')) {
      local_368 = &this->connectionState;
      local_360 = this;
      kj::
      runCatchingExceptions<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef::~QuestionRef()::_lambda()_1_>
                ((Maybe<kj::Exception> *)&local_1b8,(kj *)&local_368,func);
      kj::_::NullableValue<kj::Exception>::NullableValue(&local_350,&local_1b8);
      kj::_::NullableValue<kj::Exception>::~NullableValue(&local_1b8);
      if (local_350.isSet == true) {
        pRVar1 = (this->connectionState).ptr.ptr;
        kj::Promise<void>::Promise((Promise<void> *)&local_1b8,&local_350.field_1.value);
        kj::TaskSet::add(&pRVar1->tasks,(Promise<void> *)&local_1b8);
        kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_1b8);
      }
      kj::_::NullableValue<kj::Exception>::~NullableValue(&local_350);
    }
    if (*(char *)(lVar2 + 0x20) == '\x01') {
      *(undefined8 *)(lVar2 + 0x18) = 0;
    }
    else {
      anon_unknown_18::
      ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::erase
                (&local_390,&((this->connectionState).ptr.ptr)->questions,this->id,in_RCX);
      kj::Array<unsigned_int>::~Array(&local_390.paramExports);
      checkIfBecameIdle((this->connectionState).ptr.ptr);
    }
  }
  kj::
  Own<kj::PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>,_std::nullptr_t>
  ::dispose(&(this->fulfiller).ptr);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::dispose
            (&(this->connectionState).ptr);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~QuestionRef() noexcept {
      // Contrary to KJ style, we declare this destructor `noexcept` because if anything in here
      // throws (without being caught) we're probably in pretty bad shape and going to be crashing
      // later anyway. Better to abort now.

      KJ_IF_SOME(c, connectionState) {
        auto& connectionState = c;

        auto& question = KJ_ASSERT_NONNULL(
            connectionState->questions.find(id), "Question ID no longer on table?");

        // Send the "Finish" message (if the connection is not already broken).
        if (connectionState->connection.is<Connected>() && !question.skipFinish) {
          KJ_IF_SOME(e, kj::runCatchingExceptions([&]() {
            auto message = connectionState->connection.get<Connected>().connection
                ->newOutgoingMessage(messageSizeHint<rpc::Finish>());
            auto builder = message->getBody().getAs<rpc::Message>().initFinish();
            builder.setQuestionId(id);
            // If we're still awaiting a return, then this request is being canceled, and we're going
            // to ignore any capabilities in the return message, so set releaseResultCaps true. If we
            // already received the return, then we've already built local proxies for the caps and
            // will send Release messages when those are destroyed.
            builder.setReleaseResultCaps(question.isAwaitingReturn);

            // Let the peer know we don't have the early cancellation bug.
            builder.setRequireEarlyCancellationWorkaround(false);

            message->send();
          })) {
            connectionState->tasks.add(kj::mv(e));
          }
        }

        // Check if the question has returned and, if so, remove it from the table.
        // Remove question ID from the table.  Must do this *after* sending `Finish` to ensure that
        // the ID is not re-allocated before the `Finish` message can be sent.
        if (question.isAwaitingReturn) {
          // Still waiting for return, so just remove the QuestionRef pointer from the table.
          question.selfRef = kj::none;
        } else {
          // Call has already returned, so we can now remove it from the table.
          connectionState->questions.erase(id, question);
          connectionState->checkIfBecameIdle();
        }
      }
    }